

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSynchronizationTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_1::SSBOConcurrentAtomicCase::deinit
          (SSBOConcurrentAtomicCase *this)

{
  ShaderProgram *this_00;
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  pointer puVar2;
  pointer puVar3;
  long lVar4;
  long lVar5;
  
  if (this->m_bufferID != 0) {
    iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x438))(1,&this->m_bufferID);
    this->m_bufferID = 0;
  }
  puVar2 = (this->m_intermediateResultBuffers).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = (this->m_intermediateResultBuffers).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)puVar3 - (long)puVar2) >> 2)) {
    lVar4 = 0;
    lVar5 = 0;
    do {
      iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
      (**(code **)(CONCAT44(extraout_var_00,iVar1) + 0x438))
                (1,(long)(this->m_intermediateResultBuffers).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar4);
      lVar5 = lVar5 + 1;
      puVar2 = (this->m_intermediateResultBuffers).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar3 = (this->m_intermediateResultBuffers).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      lVar4 = lVar4 + 4;
    } while (lVar5 < (int)((ulong)((long)puVar3 - (long)puVar2) >> 2));
  }
  if (puVar3 != puVar2) {
    (this->m_intermediateResultBuffers).
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_finish = puVar2;
  }
  this_00 = this->m_program;
  if (this_00 != (ShaderProgram *)0x0) {
    glu::ShaderProgram::~ShaderProgram(this_00);
  }
  operator_delete(this_00,0xd0);
  this->m_program = (ShaderProgram *)0x0;
  return;
}

Assistant:

void SSBOConcurrentAtomicCase::deinit (void)
{
	if (m_bufferID)
	{
		m_context.getRenderContext().getFunctions().deleteBuffers(1, &m_bufferID);
		m_bufferID = 0;
	}

	for (int ndx = 0; ndx < (int)m_intermediateResultBuffers.size(); ++ndx)
		m_context.getRenderContext().getFunctions().deleteBuffers(1, &m_intermediateResultBuffers[ndx]);
	m_intermediateResultBuffers.clear();

	delete m_program;
	m_program = DE_NULL;
}